

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

int mbedtls_gcm_crypt_and_tag
              (mbedtls_gcm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,uchar *add,
              size_t add_len,uchar *input,uchar *output,size_t tag_len,uchar *tag)

{
  int ret;
  uchar *add_local;
  size_t iv_len_local;
  uchar *iv_local;
  size_t length_local;
  int mode_local;
  mbedtls_gcm_context *ctx_local;
  
  ctx_local._4_4_ = mbedtls_gcm_starts(ctx,mode,iv,iv_len,add,add_len);
  if (((ctx_local._4_4_ == 0) &&
      (ctx_local._4_4_ = mbedtls_gcm_update(ctx,length,input,output), ctx_local._4_4_ == 0)) &&
     (ctx_local._4_4_ = mbedtls_gcm_finish(ctx,tag,tag_len), ctx_local._4_4_ == 0)) {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_gcm_crypt_and_tag( mbedtls_gcm_context *ctx,
                       int mode,
                       size_t length,
                       const unsigned char *iv,
                       size_t iv_len,
                       const unsigned char *add,
                       size_t add_len,
                       const unsigned char *input,
                       unsigned char *output,
                       size_t tag_len,
                       unsigned char *tag )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    GCM_VALIDATE_RET( ctx != NULL );
    GCM_VALIDATE_RET( iv != NULL );
    GCM_VALIDATE_RET( add_len == 0 || add != NULL );
    GCM_VALIDATE_RET( length == 0 || input != NULL );
    GCM_VALIDATE_RET( length == 0 || output != NULL );
    GCM_VALIDATE_RET( tag != NULL );

    if( ( ret = mbedtls_gcm_starts( ctx, mode, iv, iv_len, add, add_len ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_gcm_update( ctx, length, input, output ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_gcm_finish( ctx, tag, tag_len ) ) != 0 )
        return( ret );

    return( 0 );
}